

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<long_double,_float>::push_bdens_fast_route
          (DensityCalculator<long_double,_float> *this,double split_point,size_t col)

{
  longdouble lVar1;
  longdouble in_ST2;
  longdouble in_ST3;
  value_type_conflict3 local_38;
  value_type_conflict3 local_28;
  
  fmaxl();
  fminl();
  logl();
  lVar1 = (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_28._0_10_ = lVar1 + in_ST2;
  fmaxl();
  fminl();
  logl();
  local_38._0_10_ = lVar1 + in_ST3;
  std::vector<long_double,_std::allocator<long_double>_>::push_back(&this->multipliers,&local_38);
  std::vector<long_double,_std::allocator<long_double>_>::push_back(&this->multipliers,&local_28);
  push_bdens_internal(this,split_point,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}